

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

_Bool borg_flow_kill_corridor(_Bool viewable)

{
  byte bVar1;
  chunk_conflict *pcVar2;
  wchar_t wVar3;
  _Bool _Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  long lVar13;
  loc lVar14;
  loc_conflict lVar15;
  wchar_t wVar12;
  loc_conflict lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  char *who;
  borg_kill *pbVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  bool bVar24;
  int local_70;
  wchar_t local_6c;
  
  pbVar20 = borg_kills;
  borg_digging = false;
  if (borg_kills_cnt == 0) {
    borg_digging = false;
    return false;
  }
  lVar13 = (long)borg_kills_summoner;
  if (lVar13 == -1) {
    borg_digging = false;
    return false;
  }
  if (borg.trait[0x6d] != 0) {
    borg_digging = false;
    return false;
  }
  if (borg.trait[0x6c] != 0) {
    borg_digging = false;
    return false;
  }
  if (500 < borg.time_this_panel) {
    borg_digging = false;
    return false;
  }
  if (borg.trait[0x72] != 0) {
    borg_digging = false;
    return false;
  }
  if (borg.trait[0x1a] == 0) {
    borg_digging = false;
    return false;
  }
  if (borg_morgoth_position) {
    borg_digging = false;
    return false;
  }
  if (borg_as_position) {
    borg_digging = false;
    return false;
  }
  _Var4 = flag_has_dbg(r_info[borg_kills[lVar13].r_idx].flags,0xb,0x15,"r_info[kill->r_idx].flags",
                       "RF_NEVER_MOVE");
  if (_Var4) {
    return false;
  }
  pbVar20 = pbVar20 + lVar13;
  _Var4 = flag_has_dbg(r_info[pbVar20->r_idx].flags,0xb,0x2e,"r_info[kill->r_idx].flags",
                       "RF_PASS_WALL");
  if (_Var4) {
    return false;
  }
  _Var4 = flag_has_dbg(r_info[pbVar20->r_idx].flags,0xb,0x2f,"r_info[kill->r_idx].flags",
                       "RF_KILL_WALL");
  if (_Var4) {
    return false;
  }
  if (pbVar20->awake != true) {
    return false;
  }
  _Var4 = borg_spell_okay(TURN_STONE_TO_MUD);
  if ((((!_Var4) && (_Var4 = borg_spell_okay(SHATTER_STONE), !_Var4)) &&
      (_Var4 = borg_equips_ring(sv_ring_digging), !_Var4)) &&
     (_Var4 = borg_equips_item(act_stone_to_mud,true), !_Var4)) {
    return false;
  }
  _Var4 = borg_los((pbVar20->pos).y,(pbVar20->pos).x,borg.c.y,borg.c.x);
  wVar12 = w_x;
  if (_Var4) goto LAB_0021b8e3;
  wVar8 = borg_panel_wid();
  wVar3 = w_y;
  wVar9 = borg_panel_hgt();
  iVar10 = wVar3 / wVar9;
  lVar13 = (long)(wVar12 / wVar8);
  if ((borg_detect_wall[iVar10][lVar13] == true) && (borg_detect_wall[iVar10][lVar13 + 1] == true))
  {
    if ((borg_detect_wall[iVar10 + 1][lVar13] != true) ||
       (borg_detect_wall[iVar10 + 1][lVar13 + 1] != true)) goto LAB_0021b892;
    borg_flow_clear();
    borg_digging = true;
    borg_flow_enqueue_grid((pbVar20->pos).y,(pbVar20->pos).x);
    _Var4 = false;
  }
  else {
LAB_0021b892:
    borg_flow_clear();
    borg_digging = true;
    borg_flow_enqueue_grid((pbVar20->pos).y,(pbVar20->pos).x);
    _Var4 = true;
  }
  borg_flow_spread(L'\n',true,_Var4,false,L'\xffffffff',false);
  _Var4 = borg_flow_commit("Monster Path",L'\x01');
  if (!_Var4) {
    return false;
  }
LAB_0021b8e3:
  local_6c = L'c';
  iVar10 = 0;
  bVar5 = false;
  iVar17 = -2;
  do {
    lVar13 = 0;
    uVar19 = 0;
    local_70 = 0;
    do {
      pcVar2 = cave;
      lVar21 = (long)*(int *)((long)&DAT_00285ab0 + lVar13) + (long)iVar17 + (long)borg.c.y;
      lVar22 = (long)*(int *)((long)&DAT_00285b90 + lVar13) + (long)borg.c.x;
      lVar14 = (loc)loc((int)lVar22,(int)lVar21);
      _Var4 = square_in_bounds_fully(pcVar2,lVar14);
      if (_Var4) {
        if (((0xdd54eUL >> (uVar19 & 0x3f) & 1) != 0) &&
           ((bVar1 = borg_grids[lVar21][lVar22].feat, bVar1 - 0x11 < 5 || (bVar1 == 0)))) {
          local_70 = local_70 + 1;
        }
        if ((((0x1f22ab1UL >> (uVar19 & 0x3f) & 1) != 0) &&
            (uVar11 = (uint)borg_grids[lVar21][lVar22].feat, uVar11 < 0x16)) &&
           ((0x3e007fU >> (uVar11 & 0x1f) & 1) != 0)) {
          local_70 = local_70 + 1;
        }
      }
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 4;
    } while (uVar19 != 0x19);
    if (local_70 == 0x19) {
      lVar15 = loc(borg.c.x,iVar17 + borg.c.y + -3);
      lVar16.y = borg.c.y;
      lVar16.x = borg.c.x;
      wVar12 = distance(lVar16,lVar15);
      if (wVar12 < local_6c) {
        lVar16 = loc(borg.c.x,iVar17 + borg.c.y + -3);
        lVar15.y = borg.c.y;
        lVar15.x = borg.c.x;
        local_6c = distance(lVar15,lVar16);
        bVar5 = true;
        iVar10 = iVar17;
      }
    }
    bVar23 = iVar17 != 0;
    iVar17 = iVar17 + 1;
  } while (bVar23);
  iVar17 = -1;
  bVar23 = false;
  do {
    lVar13 = 0;
    uVar19 = 0;
    local_70 = 0;
    do {
      pcVar2 = cave;
      lVar21 = (long)*(int *)((long)&DAT_00285b20 + lVar13) + (long)iVar17 + (long)borg.c.y;
      lVar22 = (long)*(int *)((long)&DAT_00285b90 + lVar13) + (long)borg.c.x;
      lVar14 = (loc)loc((int)lVar22,(int)lVar21);
      _Var4 = square_in_bounds_fully(pcVar2,lVar14);
      if (_Var4) {
        if (((0xe55760UL >> (uVar19 & 0x3f) & 1) != 0) &&
           ((bVar1 = borg_grids[lVar21][lVar22].feat, bVar1 - 0x11 < 5 || (bVar1 == 0)))) {
          local_70 = local_70 + 1;
        }
        if ((((0x11aa89fUL >> (uVar19 & 0x3f) & 1) != 0) &&
            (uVar11 = (uint)borg_grids[lVar21][lVar22].feat, uVar11 < 0x16)) &&
           ((0x3e007fU >> (uVar11 & 0x1f) & 1) != 0)) {
          local_70 = local_70 + 1;
        }
      }
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 4;
    } while (uVar19 != 0x19);
    if ((local_70 == 0x19) &&
       (wVar12 = borg_distance(borg.c.y,borg.c.x,iVar17 + borg.c.y + L'\x03',borg.c.x),
       wVar12 < local_6c)) {
      local_6c = borg_distance(borg.c.y,borg.c.x,iVar17 + borg.c.y + L'\x03',borg.c.x);
      bVar23 = true;
      bVar5 = false;
      iVar10 = iVar17;
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 != 2);
  iVar17 = 0;
  iVar18 = -1;
  bVar6 = false;
  do {
    lVar13 = 0;
    uVar19 = 0;
    local_70 = 0;
    do {
      pcVar2 = cave;
      lVar22 = (long)*(int *)((long)&DAT_00285c70 + lVar13) + (long)borg.c.y;
      lVar21 = (long)*(int *)((long)&DAT_00285c00 + lVar13) + (long)iVar18 + (long)borg.c.x;
      lVar14 = (loc)loc((int)lVar21,(int)lVar22);
      _Var4 = square_in_bounds_fully(pcVar2,lVar14);
      if (_Var4) {
        if (((0x6d5346UL >> (uVar19 & 0x3f) & 1) != 0) &&
           ((bVar1 = borg_grids[lVar22][lVar21].feat, bVar1 - 0x11 < 5 || (bVar1 == 0)))) {
          local_70 = local_70 + 1;
        }
        if ((((0x192acb9UL >> (uVar19 & 0x3f) & 1) != 0) &&
            (uVar11 = (uint)borg_grids[lVar22][lVar21].feat, uVar11 < 0x16)) &&
           ((0x3e007fU >> (uVar11 & 0x1f) & 1) != 0)) {
          local_70 = local_70 + 1;
        }
      }
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 4;
    } while (uVar19 != 0x19);
    if ((local_70 == 0x19) &&
       (wVar12 = borg_distance(borg.c.y,borg.c.x,borg.c.y,iVar18 + borg.c.x + L'\x03'),
       wVar12 < local_6c)) {
      local_6c = borg_distance(borg.c.y,borg.c.x,borg.c.y,iVar18 + borg.c.x + L'\x03');
      bVar23 = false;
      bVar6 = true;
      bVar5 = false;
      iVar10 = 0;
      iVar17 = iVar18;
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 2);
  bVar7 = false;
  iVar18 = -2;
  do {
    lVar13 = 0;
    uVar19 = 0;
    local_70 = 0;
    do {
      pcVar2 = cave;
      lVar22 = (long)*(int *)((long)&DAT_00285c70 + lVar13) + (long)borg.c.y;
      lVar21 = (long)*(int *)((long)&DAT_00285ce0 + lVar13) + (long)iVar18 + (long)borg.c.x;
      lVar14 = (loc)loc((int)lVar21,(int)lVar22);
      _Var4 = square_in_bounds_fully(pcVar2,lVar14);
      if (_Var4) {
        if (((0xc5956cUL >> (uVar19 & 0x3f) & 1) != 0) &&
           ((bVar1 = borg_grids[lVar22][lVar21].feat, bVar1 - 0x11 < 5 || (bVar1 == 0)))) {
          local_70 = local_70 + 1;
        }
        if ((((0x13a6a93UL >> (uVar19 & 0x3f) & 1) != 0) &&
            (uVar11 = (uint)borg_grids[lVar22][lVar21].feat, uVar11 < 0x16)) &&
           ((0x3e007fU >> (uVar11 & 0x1f) & 1) != 0)) {
          local_70 = local_70 + 1;
        }
      }
      uVar19 = uVar19 + 1;
      lVar13 = lVar13 + 4;
    } while (uVar19 != 0x19);
    if ((local_70 == 0x19) &&
       (wVar12 = borg_distance(borg.c.y,borg.c.x,borg.c.y,iVar18 + borg.c.x + L'\xfffffffd'),
       wVar12 < local_6c)) {
      local_6c = borg_distance(borg.c.y,borg.c.x,borg.c.y,iVar18 + borg.c.x + L'\xfffffffd');
      bVar6 = false;
      bVar7 = true;
      bVar23 = false;
      bVar5 = false;
      iVar10 = 0;
      iVar17 = iVar18;
    }
    bVar24 = iVar18 != 0;
    iVar18 = iVar18 + 1;
  } while (bVar24);
  if (bVar5) {
    borg_flow_clear();
    borg_digging = true;
    borg_flow_enqueue_grid(iVar10 + borg.c.y + L'\xfffffffd',iVar17 + borg.c.x);
    borg_flow_spread(L'\x05',true,false,true,L'\xffffffff',false);
    who = "anti-summon corridor north type 1";
  }
  else if (bVar23) {
    borg_flow_clear();
    borg_digging = true;
    borg_flow_enqueue_grid(iVar10 + borg.c.y + L'\x03',iVar17 + borg.c.x);
    borg_flow_spread(L'\x06',true,false,true,L'\xffffffff',false);
    who = "anti-summon corridor south type 1";
  }
  else if (bVar6) {
    borg_flow_clear();
    borg_digging = true;
    borg_flow_enqueue_grid(iVar10 + borg.c.y,iVar17 + borg.c.x + L'\x03');
    borg_digging = true;
    borg_flow_spread(L'\x05',true,false,true,L'\xffffffff',false);
    who = "anti-summon corridor east type 1";
  }
  else {
    if (!bVar7) {
      return false;
    }
    borg_flow_clear();
    borg_digging = true;
    borg_flow_enqueue_grid(iVar10 + borg.c.y,iVar17 + borg.c.x + L'\xfffffffd');
    borg_flow_spread(L'\x05',true,false,true,L'\xffffffff',false);
    who = "anti-summon corridor west type 1";
  }
  _Var4 = borg_flow_commit(who,L'\n');
  if (!_Var4) {
    return false;
  }
  _Var4 = borg_flow_old(L'\n');
  return _Var4;
}

Assistant:

bool borg_flow_kill_corridor(bool viewable)
{
    int o_y = 0;
    int o_x = 0;
    int m_x = 0;
    int m_y = 0;
    int b_y = 0, b_x = 0;
    int b_distance = 99;

    int  i;
    bool b_n        = false;
    bool b_s        = false;
    bool b_e        = false;
    bool b_w        = false;

    int n_array[25] = { 1, 0, 0, 0, 1, 
                        1, 0, 1, 0, 1, 
                        0, 1, 0, 1, 0, 
                        0, 0, 1, 0, 0, 
                        1, 1, 1, 1, 1 };
    int ny[25] = { -4, -4, -4, -4, -4, 
                   -3, -3, -3, -3, -3, 
                   -2, -2, -2, -2, -2,
                   -1, -1, -1, -1, -1, 
                    0,  0,  0,  0,  0 };
    int nx[25] = { -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2 };

    int s_array[25] = { 1, 1, 1, 1, 1, 
                        0, 0, 1, 0, 0, 
                        0, 1, 0, 1, 0, 
                        1, 0, 1, 0, 1, 
                        1, 0, 0, 0, 1 };
    int sy[25] = { 0, 0, 0, 0, 0, 
                   1, 1, 1, 1, 1, 
                   2, 2, 2, 2, 2, 
                   3, 3, 3, 3, 3,
                   4, 4, 4, 4, 4 };
    int sx[25] = { -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2, 
                   -2, -1,  0,  1,  2 };

    int e_array[25] = { 1, 0, 0, 1, 1, 
                        1, 0, 1, 0, 0, 
                        1, 1, 0, 1, 0, 
                        1, 0, 1, 0, 0, 
                        1, 0, 0, 1, 1 };
    int ey[25] = { -2, -2, -2, -2, -2, 
                   -1, -1, -1, -1, -1, 
                    0,  0,  0,  0,  0, 
                    1,  1,  1,  1,  1, 
                    2,  2,  2,  2,  2 };
    int ex[25] = { 0, 1, 2, 3, 4, 
                   0, 1, 2, 3, 4, 
                   0, 1, 2, 3, 4, 
                   0, 1, 2, 3, 4,
                   0, 1, 2, 3, 4 };

    int w_array[25] = { 1, 1, 0, 0, 1, 
                        0, 0, 1, 0, 1, 
                        0, 1, 0, 1, 1, 
                        0, 0, 1, 0, 1, 
                        1, 1, 0, 0, 1 };
    int wy[25] = { -2, -2, -2, -2, -2, 
                   -1, -1, -1, -1, -1, 
                    0,  0,  0,  0,  0, 
                    1,  1,  1,  1,  1, 
                    2,  2,  2,  2,  2 };
    int wx[25] = { -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0, 
                   -4, -3, -2, -1, 0 };

    int wall_north = 0;
    int wall_south = 0;
    int wall_east  = 0;
    int wall_west  = 0;
    int q_x;
    int q_y;

    borg_kill *kill;

    borg_digging = false;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Only do this to summoners when they are close*/
    if (borg_kills_summoner == -1)
        return false;

    /* Hungry,starving */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Sometimes we loop on this */
    if (borg.time_this_panel > 500)
        return false;

    /* Do not dig when confused */
    if (borg.trait[BI_ISCONFUSED])
        return false;

    /* Not when darkened */
    if (borg.trait[BI_LIGHT] == 0)
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;
    if (borg_as_position)
        return false;

    /* get the summoning monster */
    kill = &borg_kills[borg_kills_summoner];

    /* Summoner must be mobile */
    if (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE))
        return false;
    /* Summoner must be able to pass through walls */
    if (rf_has(r_info[kill->r_idx].flags, RF_PASS_WALL))
        return false;
    if (rf_has(r_info[kill->r_idx].flags, RF_KILL_WALL))
        return false;

    /* Summoner has to be awake (so he will chase me */
    if (!kill->awake)
        return false;

    /* Must have Stone to Mud spell */
    if (!borg_spell_okay(TURN_STONE_TO_MUD) && !borg_spell_okay(SHATTER_STONE)
        && !borg_equips_ring(sv_ring_digging)
        && !borg_equips_item(act_stone_to_mud, true))
        return false;

    /* Summoner needs to be able to follow me.
     * So I either need to be able to
     * 1) have LOS on him or
     * 2) this panel needs to have had Magic Map or Wizard light cast on it.
     * If Mapped, then the flow codes needs to be used.
     */
    if (!borg_los(kill->pos.y, kill->pos.x, borg.c.y, borg.c.x)) {
        /* Extract panel */
        q_x = w_x / borg_panel_wid();
        q_y = w_y / borg_panel_hgt();

        if (borg_detect_wall[q_y + 0][q_x + 0] == true
            && borg_detect_wall[q_y + 0][q_x + 1] == true
            && borg_detect_wall[q_y + 1][q_x + 0] == true
            && borg_detect_wall[q_y + 1][q_x + 1] == true) {
            borg_flow_clear();
            borg_digging = true;
            borg_flow_enqueue_grid(kill->pos.y, kill->pos.x);
            borg_flow_spread(10, true, false, false, -1, false);
            if (!borg_flow_commit("Monster Path", GOAL_KILL))
                return false;
        } else {
            borg_flow_clear();
            borg_digging = true;
            borg_flow_enqueue_grid(kill->pos.y, kill->pos.x);
            borg_flow_spread(10, true, true, false, -1, false);
            if (!borg_flow_commit("Monster Path", GOAL_KILL))
                return false;
        }
    }

    /* NORTH -- Consider each area near the borg, looking for a good spot to
     * hide */
    for (o_y = -2; o_y < 1; o_y++) {
        /* Reset Wall count */
        wall_north = 0;

        /* No E-W offset when looking North-South */
        o_x = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + ny[i];
            m_x = borg.c.x + o_x + nx[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y))) {
                continue;
            }

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (n_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_north++;
            }
            if (n_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_north++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_north == 25) {
            if (distance(
                    borg.c, loc(borg.c.x + o_x + nx[7], borg.c.y + o_y + ny[7]))
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_n        = true;
                b_distance = distance(borg.c,
                    loc(borg.c.x + o_x + nx[7], borg.c.y + o_y + ny[7]));
            }
        }
    }

    /* SOUTH -- Consider each area near the borg, looking for a good spot to
     * hide */
    for (o_y = -1; o_y < 2; o_y++) {
        /* Reset Wall count */
        wall_south = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* No lateral offset on South check */
            o_x = 0;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + sy[i];
            m_x = borg.c.x + o_x + sx[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y)))
                continue;

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (s_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_south++;
            }
            if (s_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_south++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_south == 25) {
            if (borg_distance(borg.c.y, borg.c.x, borg.c.y + o_y + sy[17],
                    borg.c.x + o_x + sx[17])
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_s        = true;
                b_n        = false;
                b_distance = borg_distance(borg.c.y, borg.c.x,
                    borg.c.y + b_y + sy[17], borg.c.x + b_x + sx[17]);
            }
        }
    }

    /* EAST -- Consider each area near the borg, looking for a good spot to hide
     */
    for (o_x = -1; o_x < 2; o_x++) {
        /* Reset Wall count */
        wall_east = 0;

        /* No N-S offset check when looking E-W */
        o_y = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + ey[i];
            m_x = borg.c.x + o_x + ex[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y)))
                continue;

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (e_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_east++;
            }
            if (e_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_east++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_east == 25) {
            if (borg_distance(borg.c.y, borg.c.x, borg.c.y + o_y + ey[13],
                    borg.c.x + o_x + ex[13])
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_e        = true;
                b_s        = false;
                b_n        = false;
                b_distance = borg_distance(borg.c.y, borg.c.x,
                    borg.c.y + b_y + ey[13], borg.c.x + b_x + ex[13]);
            }
        }
    }

    /* WEST -- Consider each area near the borg, looking for a good spot to hide
     */
    for (o_x = -2; o_x < 1; o_x++) {
        /* Reset Wall count */
        wall_west = 0;

        /* No N-S offset check when looking E-W */
        o_y = 0;

        for (i = 0; i < 25; i++) {
            borg_grid *ag;

            /* Check grids near borg */
            m_y = borg.c.y + o_y + wy[i];
            m_x = borg.c.x + o_x + wx[i];

            /* avoid screen edges */
            if (!square_in_bounds_fully(cave, loc(m_x, m_y)))
                continue;

            /* grid the grid */
            ag = &borg_grids[m_y][m_x];

            /* Certain grids must not be floor types */
            if (w_array[i] == 0
                && ((ag->feat == FEAT_NONE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* This is a good grid */
                wall_west++;
            }
            if (w_array[i] == 1
                && ((ag->feat <= FEAT_MORE)
                    || (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_QUARTZ_K)
                    || ag->feat == FEAT_GRANITE)) {
                /* A good wall would score 25. */
                wall_west++;
            }
        }

        /* If I found 25 grids, then that spot will work well */
        if (wall_west == 25) {
            if (borg_distance(borg.c.y, borg.c.x, borg.c.y + o_y + wy[11],
                    borg.c.x + o_x + wx[11])
                < b_distance) {
                b_y        = o_y;
                b_x        = o_x;
                b_w        = true;
                b_e        = false;
                b_s        = false;
                b_n        = false;
                b_distance = borg_distance(borg.c.y, borg.c.x,
                    borg.c.y + o_y + wy[11], borg.c.x + o_x + wx[11]);
            }
        }
    }

    /* Attempt to enqueue the grids that should be floor grids and have the
     * borg move onto those grids
     */
    if (b_n == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(borg.c.y + b_y + ny[7], borg.c.x + b_x + nx[7]);

        /* Spread the flow */
        borg_flow_spread(5, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit(
                "anti-summon corridor north type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }
    if (b_s == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(
            borg.c.y + b_y + sy[17], borg.c.x + b_x + sx[17]);

        /* Spread the flow */
        borg_flow_spread(6, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit(
                "anti-summon corridor south type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }
    if (b_e == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(
            borg.c.y + b_y + ey[13], borg.c.x + b_x + ex[13]);

        /* Spread the flow */
        borg_digging = true;
        borg_flow_spread(5, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit("anti-summon corridor east type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }
    if (b_w == true) {
        /* Clear the flow codes */
        borg_flow_clear();

        /* Enqueue the grid where I will hide */
        borg_digging = true;
        borg_flow_enqueue_grid(
            borg.c.y + b_y + wy[11], borg.c.x + b_x + wx[11]);

        /* Spread the flow */
        borg_flow_spread(5, true, false, true, -1, false);

        /* Attempt to Commit the flow */
        if (!borg_flow_commit("anti-summon corridor west type 1", GOAL_DIGGING))
            return false;

        /* Take one step */
        if (!borg_flow_old(GOAL_DIGGING))
            return false;

        return true;
    }

    return false;
}